

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::try_statement::try_statement
          (try_statement *this,source_extend *extend,statement_ptr *block,statement_ptr *catch_,
          wstring *catch_id,statement_ptr *finally_)

{
  statement *psVar1;
  int iVar2;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__try_statement_001be8c0;
  (this->block_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (block->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (block->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  (this->catch_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (catch_->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (catch_->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  std::__cxx11::wstring::wstring((wstring *)&this->catch_id_,(wstring *)catch_id);
  (this->finally_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (finally_->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (finally_->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  psVar1 = (this->block_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    iVar2 = (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar2 == 0) {
      psVar1 = (this->catch_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      if (((this->catch_id_)._M_string_length == 0) == (psVar1 != (statement *)0x0)) {
        __assert_fail("!this->catch_ == catch_id_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                      ,0x395,
                      "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                     );
      }
      if (psVar1 != (statement *)0x0) {
        iVar2 = (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x18))();
        if (iVar2 != 0) {
          __assert_fail("!this->catch_ || this->catch_->type() == statement_type::block",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                        ,0x396,
                        "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                       );
        }
      }
      psVar1 = (this->finally_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      if (psVar1 != (statement *)0x0) {
        iVar2 = (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x18))();
        if (iVar2 != 0) {
          __assert_fail("!this->finally_ || this->finally_->type() == statement_type::block",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                        ,0x397,
                        "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
                       );
        }
      }
      return;
    }
  }
  __assert_fail("block_ && block_->type() == statement_type::block",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x394,
                "mjs::try_statement::try_statement(const source_extend &, statement_ptr &&, statement_ptr &&, const std::wstring &, statement_ptr &&)"
               );
}

Assistant:

explicit try_statement(const source_extend& extend, statement_ptr&& block, statement_ptr&& catch_, const std::wstring& catch_id, statement_ptr&& finally_)
        : statement(extend)
        , block_(std::move(block))
        , catch_(std::move(catch_))
        , catch_id_(catch_id)
        , finally_(std::move(finally_)) {
        assert(block_ && block_->type() == statement_type::block);
        assert(!this->catch_ == catch_id_.empty());
        assert(!this->catch_ || this->catch_->type() == statement_type::block);
        assert(!this->finally_ || this->finally_->type() == statement_type::block);
    }